

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void apply_imputation_results<PredictionData<double,int>,ImputedData<int,double>>
               (PredictionData<double,_int> *prediction_data,ImputedData<int,_double> *imp,
               Imputer *imputer,size_t row)

{
  double dVar1;
  bool bVar2;
  size_t sVar3;
  pointer puVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  double *pdVar8;
  size_t sVar9;
  unsigned_long uVar10;
  pointer piVar11;
  pointer pvVar12;
  int *piVar13;
  int iVar14;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var15;
  size_t ix;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  long lVar19;
  double dVar20;
  
  bVar2 = prediction_data->is_col_major;
  sVar3 = imp->n_missing_num;
  puVar4 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar5 = (imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (imp->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = prediction_data->numeric_data;
  if (bVar2 == false) {
    sVar9 = imputer->ncols_numeric;
    for (sVar18 = 0; sVar3 != sVar18; sVar18 = sVar18 + 1) {
      uVar10 = puVar4[sVar18];
      dVar1 = pdVar6[sVar18];
      if (((dVar1 <= 0.0) || (dVar20 = pdVar5[sVar18], 0x7fefffffffffffff < (ulong)ABS(dVar20))) ||
         ((dVar20 == 0.0 && ((!NAN(dVar20) && (NAN(pdVar7[uVar10]))))))) {
        dVar20 = pdVar7[uVar10];
      }
      else {
        dVar20 = dVar20 / dVar1;
      }
      pdVar8[sVar9 * row + uVar10] = dVar20;
    }
  }
  else {
    sVar9 = prediction_data->nrows;
    for (sVar18 = 0; sVar3 != sVar18; sVar18 = sVar18 + 1) {
      uVar10 = puVar4[sVar18];
      dVar1 = pdVar6[sVar18];
      if (((dVar1 <= 0.0) || (dVar20 = pdVar5[sVar18], 0x7fefffffffffffff < (ulong)ABS(dVar20))) ||
         ((dVar20 == 0.0 && ((!NAN(dVar20) && (NAN(pdVar7[uVar10]))))))) {
        dVar20 = pdVar7[uVar10];
      }
      else {
        dVar20 = dVar20 / dVar1;
      }
      pdVar8[row + uVar10 * sVar9] = dVar20;
    }
  }
  pdVar8 = prediction_data->Xr;
  if (pdVar8 != (double *)0x0) {
    iVar14 = prediction_data->Xr_indptr[row + 1];
    pdVar5 = (imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (imp->sp_num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar11 = (imp->missing_sp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar19 = 0;
    for (lVar17 = (long)prediction_data->Xr_indptr[row]; lVar17 < iVar14; lVar17 = lVar17 + 1) {
      if (0x7fefffffffffffff < (ulong)ABS(pdVar8[lVar17])) {
        dVar1 = pdVar6[lVar19];
        if ((dVar1 <= 0.0) || (dVar20 = pdVar5[lVar19], 0x7fefffffffffffff < (ulong)ABS(dVar20))) {
          dVar20 = pdVar7[piVar11[lVar19]];
        }
        else {
          dVar20 = dVar20 / dVar1;
        }
        pdVar8[lVar17] = dVar20;
        lVar19 = lVar19 + 1;
      }
    }
  }
  if (bVar2 == false) {
    for (uVar16 = 0; uVar16 < imp->n_missing_cat; uVar16 = uVar16 + 1) {
      pvVar12 = (imp->cat_sum).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar16];
      lVar17 = *(long *)&pvVar12[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data;
      _Var15 = std::
               __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                         (lVar17,*(pointer *)
                                  ((long)&pvVar12[uVar10].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data + 8));
      lVar19 = imputer->ncols_categ * row;
      piVar13 = prediction_data->categ_data;
      iVar14 = (int)((ulong)((long)_Var15._M_current - lVar17) >> 3);
      piVar13[uVar10 + lVar19] = iVar14;
      if (iVar14 == 0) {
        pvVar12 = (imp->cat_sum).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar14 = -1;
        if ((pvVar12 !=
             (imp->cat_sum).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (pdVar8 = pvVar12[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
           pdVar8 != pvVar12[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish)) {
          if (0.0 < *pdVar8) goto LAB_001bc31b;
          iVar14 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10];
        }
        piVar13[uVar10 + lVar19] = iVar14;
      }
LAB_001bc31b:
    }
  }
  else {
    for (uVar16 = 0; uVar16 < imp->n_missing_cat; uVar16 = uVar16 + 1) {
      pvVar12 = (imp->cat_sum).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar16];
      lVar17 = *(long *)&pvVar12[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data;
      _Var15 = std::
               __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                         (lVar17,*(pointer *)
                                  ((long)&pvVar12[uVar10].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data + 8));
      lVar19 = prediction_data->nrows * uVar10;
      piVar13 = prediction_data->categ_data;
      iVar14 = (int)((ulong)((long)_Var15._M_current - lVar17) >> 3);
      piVar13[lVar19 + row] = iVar14;
      if (iVar14 == 0) {
        pvVar12 = (imp->cat_sum).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar14 = -1;
        if ((pvVar12 !=
             (imp->cat_sum).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (pdVar8 = pvVar12[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
           pdVar8 != pvVar12[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish)) {
          if (0.0 < *pdVar8) goto LAB_001bc289;
          iVar14 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10];
        }
        piVar13[lVar19 + row] = iVar14;
      }
LAB_001bc289:
    }
  }
  return;
}

Assistant:

void apply_imputation_results(PredictionData  &prediction_data,
                              ImputedData     &imp,
                              Imputer         &imputer,
                              size_t          row)
{
    size_t col;
    size_t pos = 0;
    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imputer.col_means[col];
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imputer.col_means[col];
        }
    }

    if (prediction_data.Xr != NULL)
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
        {
            if (is_na_or_inf(prediction_data.Xr[ix]))
            {
                if (imp.sp_num_weight[pos] > 0 && !is_na_or_inf(imp.sp_num_sum[pos]))
                    prediction_data.Xr[ix]
                        =
                    imp.sp_num_sum[pos] / imp.sp_num_weight[pos];
                else
                    prediction_data.Xr[ix]
                        =
                    imputer.col_means[imp.missing_sp[pos]];
                pos++;
            }
        }

    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[row + col * prediction_data.nrows] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows] = -1;
                }

                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[col + row * imputer.ncols_categ] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ] = -1;
                }
                
                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }
}